

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

void __thiscall
HighsDomain::conflictAnalysis
          (HighsDomain *this,HighsInt *proofinds,double *proofvals,HighsInt prooflen,double proofrhs
          ,HighsConflictPool *conflictPool)

{
  HighsDomain *this_00;
  HighsMipSolverData *pHVar1;
  ConflictSet conflictSet;
  ConflictSet local_e8;
  
  pHVar1 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar1->domain;
  if ((this_00 != this) && ((pHVar1->domain).infeasible_ == false)) {
    propagate(this_00);
    if ((((this->mipsolver->mipdata_)._M_t.
          super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
          super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
          super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).infeasible_ ==
        false) {
      ConflictSet::ConflictSet(&local_e8,this);
      ConflictSet::conflictAnalysis(&local_e8,proofinds,proofvals,prooflen,proofrhs,conflictPool);
      ConflictSet::~ConflictSet(&local_e8);
    }
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalysis(const HighsInt* proofinds,
                                   const double* proofvals, HighsInt prooflen,
                                   double proofrhs,
                                   HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;

  if (mipsolver->mipdata_->domain.infeasible()) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);
  conflictSet.conflictAnalysis(proofinds, proofvals, prooflen, proofrhs,
                               conflictPool);
}